

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

void __thiscall QAbstractSocket::~QAbstractSocket(QAbstractSocket *this)

{
  long lVar1;
  QAbstractSocketPrivate *d;
  
  *(undefined ***)this = &PTR_metaObject_002d1518;
  lVar1 = *(long *)&this->field_0x8;
  if (*(int *)(lVar1 + 0x260) != 0) {
    QIODevicePrivate::setWriteChannelCount((int)lVar1);
    *(undefined1 *)(lVar1 + 0x192) = 1;
    (**(code **)(*(long *)this + 0x70))(this);
  }
  QIODevice::~QIODevice(&this->super_QIODevice);
  return;
}

Assistant:

QAbstractSocket::~QAbstractSocket()
{
    Q_D(QAbstractSocket);
#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::~QAbstractSocket()");
#endif
    if (d->state != UnconnectedState)
        abort();
}